

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp analyze_if(sexp ctx,sexp x,int depth)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  char *message;
  sexp psVar4;
  sexp pass;
  sexp test;
  sexp fail;
  sexp local_78;
  sexp local_70;
  sexp local_68;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_40.var = &local_78;
  local_60.var = &local_70;
  local_70 = (sexp)0x43e;
  local_78 = (sexp)0x43e;
  local_50.var = &local_68;
  local_68 = (sexp)0x43e;
  local_40.next = &local_60;
  local_60.next = (ctx->value).context.saves;
  local_50.next = &local_40;
  (ctx->value).context.saves = &local_50;
  psVar2 = (x->value).type.cpl;
  if ((((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 6)) &&
      (psVar1 = (psVar2->value).type.cpl, ((ulong)psVar1 & 3) == 0)) && (psVar1->tag == 6)) {
    psVar1 = (psVar1->value).type.cpl;
    if (((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 6)) ||
       ((psVar1->value).type.cpl == (sexp)0x23e)) {
      psVar2 = analyze(ctx,(psVar2->value).type.name,depth,0);
      if (((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) &&
         ((local_70 = psVar2,
          psVar2 = analyze(ctx,(((((x->value).type.cpl)->value).type.cpl)->value).type.name,depth,0)
          , ((ulong)psVar2 & 3) != 0 || (psVar2->tag != 0x13)))) {
        psVar1 = (((((x->value).type.cpl)->value).type.cpl)->value).type.cpl;
        psVar4 = (sexp)&DAT_0000043e;
        if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 6)) {
          psVar4 = (psVar1->value).type.name;
        }
        local_78 = psVar2;
        psVar2 = analyze(ctx,psVar4,depth,0);
        psVar4 = local_70;
        psVar1 = local_78;
        if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
          local_68 = psVar2;
          psVar3 = sexp_alloc_tagged_aux(ctx,0x28,0x1d);
          (psVar3->value).type.name = psVar4;
          (psVar3->value).type.cpl = psVar1;
          (psVar3->value).type.slots = psVar2;
          psVar2 = psVar3;
        }
      }
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 0x1d)) {
        (psVar2->value).type.getters = (x->value).type.slots;
      }
      goto LAB_0012c3d8;
    }
    message = "too many args to if";
  }
  else {
    message = "not enough args to if";
  }
  local_40.var = &local_78;
  psVar2 = sexp_compile_error(ctx,message,x);
LAB_0012c3d8:
  (ctx->value).context.saves = local_60.next;
  return psVar2;
}

Assistant:

static sexp analyze_if (sexp ctx, sexp x, int depth) {
  sexp res, fail_expr;
  sexp_gc_var3(test, pass, fail);
  sexp_gc_preserve3(ctx, test, pass, fail);
  if (! (sexp_pairp(sexp_cdr(x)) && sexp_pairp(sexp_cddr(x)))) {
    res = sexp_compile_error(ctx, "not enough args to if", x);
  } else if (sexp_pairp(sexp_cdddr(x)) && sexp_cdr(sexp_cdddr(x)) != SEXP_NULL) {
    res = sexp_compile_error(ctx, "too many args to if", x);
  } else {
    test = analyze(ctx, sexp_cadr(x), depth, 0);
    if (sexp_exceptionp(test)) {
      res = test;
    } else {
      pass = analyze(ctx, sexp_caddr(x), depth, 0);
      if (sexp_exceptionp(pass)) {
        res = pass;
      } else {
        fail_expr = sexp_pairp(sexp_cdddr(x)) ? sexp_cadddr(x) : SEXP_VOID;
        fail = analyze(ctx, fail_expr, depth, 0);
        res = sexp_exceptionp(fail) ? fail : sexp_make_cnd(ctx, test, pass, fail);
      }
    }
    if (sexp_cndp(res)) sexp_cnd_source(res) = sexp_pair_source(x);
  }
  sexp_gc_release3(ctx);
  return res;
}